

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_codepoint<8ul,char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char prefix,uint32_t cp)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char buf [8];
  char local_20 [8];
  
  uVar4 = (out.container)->size_ + 1;
  if ((out.container)->capacity_ < uVar4) {
    (*(out.container)->grow_)(out.container,uVar4);
  }
  sVar1 = (out.container)->size_;
  (out.container)->size_ = sVar1 + 1;
  (out.container)->ptr_[sVar1] = '\\';
  uVar4 = (out.container)->size_ + 1;
  if ((out.container)->capacity_ < uVar4) {
    (*(out.container)->grow_)(out.container,uVar4);
  }
  sVar1 = (out.container)->size_;
  (out.container)->size_ = sVar1 + 1;
  (out.container)->ptr_[sVar1] = prefix;
  builtin_strncpy(local_20,"00000000",8);
  pcVar3 = local_20 + 7;
  do {
    *pcVar3 = "0123456789abcdef"[cp & 0xf];
    pcVar3 = pcVar3 + -1;
    bVar2 = 0xf < cp;
    cp = cp >> 4;
  } while (bVar2);
  buffer<char>::append<char>(out.container,local_20,&stack0xffffffffffffffe8);
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_base2e(4, buf, cp, width);
  return copy<Char>(buf, buf + width, out);
}